

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void factor(item *x)

{
  item *x_00;
  object *y;
  object **ppoVar1;
  object *fp;
  procFixStruct *ppVar2;
  procFixStruct *ppVar3;
  int iVar4;
  int iVar5;
  char *msg;
  
  x_00 = (item *)calloc(1,0x30);
  if (0x1f5 < currentSymbol) {
    iVar4 = intTypeIndex;
    iVar5 = numberVal;
    if (currentSymbol != 0x1f6) {
      if (currentSymbol != 0x1f8) goto LAB_001070c0;
      iVar4 = charTypeIndex;
      iVar5 = (int)idName[0];
    }
    x->mode = 0x2bd;
    x->typeIndex = iVar4;
    x->a = iVar5;
    x->b = 0;
    x->c = 0;
    x->idx = 0;
    x->lev = 0;
    x->r = 0;
LAB_0010702b:
    getSymbol();
    return;
  }
  if (currentSymbol == 0x12d) {
    getSymbol();
    expression(x);
    if (currentSymbol != 0x12e) {
      msg = "missing right paranetheses";
      goto LAB_001070c7;
    }
    goto LAB_0010702b;
  }
  if (currentSymbol == 0x1f5) {
    y = find();
    getSymbol();
    makeItem(x,y);
    if (x->mode == 0x2c4) {
      param(x_00);
      if (6 < y->val) {
        return;
      }
      IOCall(x,x_00);
      return;
    }
    if (x->mode != 0x2c0) {
      selector(x);
      return;
    }
    ppoVar1 = &y->dsc;
    if (y->val < 0) {
      ppoVar1 = &(*ppoVar1)->next;
    }
    fp = *ppoVar1;
    if (currentSymbol == 0x12d) {
      getSymbol();
      while (currentSymbol != 0x12e) {
        while (fp = parameter(fp), currentSymbol == 0xcc) {
          getSymbol();
        }
      }
      getSymbol();
    }
    iVar4 = pc;
    if (fp->cl == 0x2c1) {
      if (fp->val < 1) goto LAB_00106f7a;
    }
    else if (fp->cl != 0x2c5) {
LAB_00106f7a:
      ppVar3 = procFixList;
      if (y->val < 0) {
        do {
          ppVar2 = ppVar3;
          ppVar3 = ppVar2->next;
        } while (ppVar3 != (procFixStruct *)0x0);
        ppVar3 = (procFixStruct *)calloc(1,0x18);
        ppVar3->pos = iVar4;
        ppVar3->proc = y;
        ppVar2->next = ppVar3;
        iVar4 = 0;
      }
      else {
        iVar4 = x->a - pc;
      }
      put(0x2e,0,0,iVar4);
      return;
    }
    msg = "too few parameters";
    goto LAB_001070c7;
  }
LAB_001070c0:
  msg = "factor ?";
LAB_001070c7:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void factor(struct item *x) {
	variable struct object *obj; variable struct object *par; variable struct object *procObj;
	variable struct item *y;
	variable bool cond;
	variable int jumpTo;
	obj = NULL; par = NULL; procObj = NULL; cond = true; jumpTo = 0; 
	allocMem(y);
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		obj = find();
		getSymbol();
		makeItem(x,obj);
		if (x->mode == CLASS_PROC) { 
			procObj = obj;
			if (procObj->val < 0) { /* prototype => dsc still points to head for further use */
				par = obj->dsc->next;
			} else {
				par = obj->dsc;
			}
			if (currentSymbol == SYMBOL_LPARAN) { 
				getSymbol(); 
				if (currentSymbol == SYMBOL_RPARAN) {
					getSymbol();
				} else {
					par = parameter(par);
					while (cond == true) {
						if (currentSymbol == SYMBOL_COMMA) {
							getSymbol();
						} elsif (currentSymbol == SYMBOL_RPARAN) {
							getSymbol();
							cond = false;
						}
						if (cond == true) {
							par = parameter(par);
						}
					}
				}
			}
			if (isParameter(par) != true) {
				if (procObj->val < 0) {
					addProcToFixList(pc,procObj);
					jumpTo = 0;
				} else {
					jumpTo = x->a - pc;
				}
				call(x,jumpTo);
			} else {
				mark("too few parameters");
				exit(-1);
			}
		} elsif (x->mode == CLASS_SPROC) { 
			param(y);
			if (obj->val <= 6) {
				IOCall(x,y);
			}
		} else {
			selector(x);
		}
	}